

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.h
# Opt level: O3

bool __thiscall
draco::PointCloudDecoder::SetAttributesDecoder
          (PointCloudDecoder *this,int att_decoder_id,
          unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
          *decoder)

{
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var1;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var2;
  pointer puVar3;
  
  if (-1 < att_decoder_id) {
    puVar3 = (this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->attributes_decoders_).
                            super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 3) <=
        att_decoder_id) {
      std::
      vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
      ::resize(&this->attributes_decoders_,(ulong)(att_decoder_id + 1));
      puVar3 = (this->attributes_decoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    _Var1._M_t.
    super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
    .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
         (tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
          )(decoder->_M_t).
           super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
           .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
    (decoder->_M_t).
    super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
    .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
         (AttributesDecoderInterface *)0x0;
    _Var2._M_t.
    super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
    .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
         puVar3[(uint)att_decoder_id]._M_t.
         super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
         ._M_t;
    puVar3[(uint)att_decoder_id]._M_t.
    super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
    ._M_t = _Var1._M_t.
            super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
            .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
    if ((_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
         )_Var2._M_t.
          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
          .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl !=
        (AttributesDecoderInterface *)0x0) {
      (**(code **)(*(long *)_Var2._M_t.
                            super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                            .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                            _M_head_impl + 8))();
    }
  }
  return -1 < att_decoder_id;
}

Assistant:

bool SetAttributesDecoder(
      int att_decoder_id, std::unique_ptr<AttributesDecoderInterface> decoder) {
    if (att_decoder_id < 0) {
      return false;
    }
    if (att_decoder_id >= static_cast<int>(attributes_decoders_.size())) {
      attributes_decoders_.resize(att_decoder_id + 1);
    }
    attributes_decoders_[att_decoder_id] = std::move(decoder);
    return true;
  }